

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O0

bool __thiscall neueda::cdr::getInteger(cdr *this,cdrKey_t *key,int32_t *value)

{
  bool bVar1;
  undefined4 *in_RDX;
  int64_t *in_RSI;
  cdrKey_t *in_RDI;
  int64_t tmp;
  undefined8 local_28;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = getInteger((cdr *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                     in_RSI);
  if (bVar1) {
    if ((local_28 < -0x80000000) || (0x7fffffff < local_28)) {
      bVar1 = false;
    }
    else {
      *in_RDX = (int)local_28;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
cdr::getInteger (const cdrKey_t& key, int32_t& value) const
{
    int64_t tmp;
    if (!getInteger (key, tmp))
        return false;
    if (tmp < INT32_MIN || tmp > INT32_MAX)
        return false;
    value = tmp;
    return true;
}